

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbedTexturesProcess.cpp
# Opt level: O0

void __thiscall Assimp::EmbedTexturesProcess::Execute(EmbedTexturesProcess *this,aiScene *pScene)

{
  undefined8 pScene_00;
  bool bVar1;
  Logger *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_01;
  basic_formatter *this_02;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  string local_498;
  uint local_478;
  uint embeddedTextureId;
  allocator<char> local_461;
  string local_460;
  uint local_440;
  uint local_43c;
  uint texId;
  uint texturesCount;
  aiTextureType tt;
  uint ttId;
  aiMaterial *material;
  uint local_420;
  uint matId;
  uint32_t embeddedTexturesCount;
  aiString path;
  aiScene *pScene_local;
  EmbedTexturesProcess *this_local;
  
  if ((pScene != (aiScene *)0x0) && (pScene->mRootNode != (aiNode *)0x0)) {
    path.data._1016_8_ = pScene;
    aiString::aiString((aiString *)&matId);
    local_420 = 0;
    for (material._4_4_ = 0; material._4_4_ < *(uint *)(path.data._1016_8_ + 0x20);
        material._4_4_ = material._4_4_ + 1) {
      _tt = *(aiMaterial **)(*(long *)(path.data._1016_8_ + 0x28) + (ulong)material._4_4_ * 8);
      for (texturesCount = 1; texturesCount < 0x12; texturesCount = texturesCount + 1) {
        texId = texturesCount;
        local_43c = aiMaterial::GetTextureCount(_tt,texturesCount);
        for (local_440 = 0; local_440 < local_43c; local_440 = local_440 + 1) {
          aiMaterial::GetTexture
                    (_tt,texId,local_440,(aiString *)&matId,(aiTextureMapping *)0x0,(uint *)0x0,
                     (ai_real *)0x0,(aiTextureOp *)0x0,(aiTextureMapMode *)0x0);
          pScene_00 = path.data._1016_8_;
          if ((char)embeddedTexturesCount != '*') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_460,(char *)&embeddedTexturesCount,&local_461);
            bVar1 = addTexture(this,(aiScene *)pScene_00,&local_460);
            std::__cxx11::string::~string((string *)&local_460);
            std::allocator<char>::~allocator(&local_461);
            if (bVar1) {
              local_478 = *(int *)(path.data._1016_8_ + 0x40) - 1;
              snprintf((char *)&embeddedTexturesCount,0x400,"*%u",(ulong)local_478);
              aiMaterial::AddProperty(_tt,(aiString *)&matId,"$tex.file",texId,local_440);
              local_420 = local_420 + 1;
            }
          }
        }
      }
    }
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[41]>(&local_610,(char (*) [41])"EmbedTexturesProcess finished. Embedded ");
    this_01 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_610,&local_420);
    this_02 = (basic_formatter *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_(this_01,(char (*) [11])" textures.");
    Formatter::basic_formatter::operator_cast_to_string(&local_498,this_02);
    Logger::info(this_00,&local_498);
    std::__cxx11::string::~string((string *)&local_498);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_610);
  }
  return;
}

Assistant:

void EmbedTexturesProcess::Execute(aiScene* pScene) {
    if (pScene == nullptr || pScene->mRootNode == nullptr) return;

    aiString path;

    uint32_t embeddedTexturesCount = 0u;

    for (auto matId = 0u; matId < pScene->mNumMaterials; ++matId) {
        auto material = pScene->mMaterials[matId];

        for (auto ttId = 1u; ttId < AI_TEXTURE_TYPE_MAX; ++ttId) {
            auto tt = static_cast<aiTextureType>(ttId);
            auto texturesCount = material->GetTextureCount(tt);

            for (auto texId = 0u; texId < texturesCount; ++texId) {
                material->GetTexture(tt, texId, &path);
                if (path.data[0] == '*') continue; // Already embedded

                // Indeed embed
                if (addTexture(pScene, path.data)) {
                    auto embeddedTextureId = pScene->mNumTextures - 1u;
                    ::ai_snprintf(path.data, 1024, "*%u", embeddedTextureId);
                    material->AddProperty(&path, AI_MATKEY_TEXTURE(tt, texId));
                    embeddedTexturesCount++;
                }
            }
        }
    }

    ASSIMP_LOG_INFO_F("EmbedTexturesProcess finished. Embedded ", embeddedTexturesCount, " textures." );
}